

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O0

size_t __thiscall
SGParser::Generator::ParseTableProduction::PrintRHS
          (ParseTableProduction *this,String *str,
          map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          *pgrammarSymbolsInv,bool printDot)

{
  size_t sVar1;
  uint *puVar2;
  undefined8 uVar3;
  mapped_type *ppbVar4;
  String local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  String local_d0;
  String local_b0;
  uint local_8c;
  undefined1 local_88 [4];
  uint terminal;
  uint local_54;
  size_t sStack_50;
  uint i;
  size_t dotPos;
  String dest;
  bool printDot_local;
  map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
  *pgrammarSymbolsInv_local;
  String *str_local;
  ParseTableProduction *this_local;
  
  dest.field_2._M_local_buf[0xf] = printDot;
  std::__cxx11::string::string((string *)&dotPos);
  sStack_50 = 0;
  for (local_54 = 0; local_54 < this->pProduction->Length; local_54 = local_54 + 1) {
    if ((this->Dot == local_54) &&
       (sStack_50 = std::__cxx11::string::size(), (dest.field_2._M_local_buf[0xf] & 1U) != 0)) {
      std::__cxx11::string::operator+=((string *)&dotPos,"* ");
    }
    puVar2 = Production::Right(this->pProduction,local_54);
    if ((*puVar2 & 0x80000000) == 0) {
      if (pgrammarSymbolsInv ==
          (map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
           *)0x0) {
        puVar2 = Production::Right(this->pProduction,local_54);
        StringWithFormat<char>(&local_110,"%u ",(ulong)*puVar2);
        std::__cxx11::string::operator+=((string *)&dotPos,(string *)&local_110);
        std::__cxx11::string::~string((string *)&local_110);
      }
      else {
        puVar2 = Production::Right(this->pProduction,local_54);
        ppbVar4 = std::
                  map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                  ::operator[](pgrammarSymbolsInv,puVar2);
        std::operator+(&local_f0,*ppbVar4," ");
        std::__cxx11::string::operator+=((string *)&dotPos,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
      }
    }
    else if (pgrammarSymbolsInv ==
             (map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
              *)0x0) {
      puVar2 = Production::Right(this->pProduction,local_54);
      local_8c = *puVar2 & 0xfffffff;
      if (local_8c < 0x22) {
        StringWithFormat<char>(&local_b0,"\'%X\' ",(ulong)local_8c);
        std::__cxx11::string::operator+=((string *)&dotPos,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      else {
        StringWithFormat<char>(&local_d0,"\'%c\' ",(ulong)(uint)(int)(char)((char)local_8c + -2));
        std::__cxx11::string::operator+=((string *)&dotPos,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
    }
    else {
      puVar2 = Production::Right(this->pProduction,local_54);
      std::
      map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
      ::operator[](pgrammarSymbolsInv,puVar2);
      uVar3 = std::__cxx11::string::data();
      StringWithFormat<char>((String *)local_88,"\'%s\' ",uVar3);
      std::__cxx11::string::operator+=((string *)&dotPos,(string *)local_88);
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  if ((this->Dot == local_54) &&
     (sStack_50 = std::__cxx11::string::size(), (dest.field_2._M_local_buf[0xf] & 1U) != 0)) {
    std::__cxx11::string::operator+=((string *)&dotPos,"* ");
  }
  std::__cxx11::string::swap((string *)str);
  sVar1 = sStack_50;
  std::__cxx11::string::~string((string *)&dotPos);
  return sVar1;
}

Assistant:

size_t ParseTableProduction::PrintRHS(String& str,
                                      std::map<unsigned, const String*>* pgrammarSymbolsInv,
                                      bool printDot) const {
    String dest;
    size_t dotPos = 0u;

    // Go through all right hand side terminals and store them
    unsigned i = 0u;
    for (; i < pProduction->Length; ++i) {
        if (Dot == i) {
            dotPos = dest.size();
            if (printDot)
                dest += "* ";
        }

        if (pProduction->Right(i) & ProductionMask::Terminal) {
            if (pgrammarSymbolsInv)
                dest += StringWithFormat("'%s' ",
                                         (*pgrammarSymbolsInv)[pProduction->Right(i)]->data());
            else {
                const unsigned terminal = pProduction->Right(i) & ProductionMask::TerminalValue;
                if (terminal < 32u + TokenCode::TokenFirstID)
                    dest += StringWithFormat("'%X' ", terminal);
                else
                    dest += StringWithFormat("'%c' ", char(terminal - TokenCode::TokenFirstID));
            }
        } else {
            if (pgrammarSymbolsInv)
                dest += *(*pgrammarSymbolsInv)[pProduction->Right(i)] + " ";
            else
                dest += StringWithFormat("%u ", pProduction->Right(i));
        }
    }

    if (Dot == i) {
        dotPos = dest.size();
        if (printDot)
            dest += "* ";
    }

    str.swap(dest);

    return dotPos;
}